

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O1

void __thiscall
QFormLayoutPrivate::setWidget(QFormLayoutPrivate *this,int row,ItemRole role,QWidget *widget)

{
  QLayout *this_00;
  bool bVar1;
  QWidgetItem *item;
  
  if (widget != (QWidget *)0x0) {
    this_00 = *(QLayout **)&(this->super_QLayoutPrivate).field_0x8;
    QLayout::addChildWidget(this_00,widget);
    item = QLayoutPrivate::createWidgetItem(this_00,widget);
    bVar1 = setItem(this,row,role,&item->super_QLayoutItem);
    if (item != (QWidgetItem *)0x0 && !bVar1) {
      (*(item->super_QLayoutItem)._vptr_QLayoutItem[1])(item);
      return;
    }
  }
  return;
}

Assistant:

void QFormLayoutPrivate::setWidget(int row, QFormLayout::ItemRole role, QWidget *widget)
{
    if (widget) {
        Q_Q(QFormLayout);
        q->addChildWidget(widget);
        QWidgetItem *item = QLayoutPrivate::createWidgetItem(q, widget);
        if (!setItem(row, role, item))
            delete item;
    }
}